

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EDColor.cpp
# Opt level: O3

void __thiscall EDColor::ComputeGradientMapByDiZenzo(EDColor *this)

{
  uchar *puVar1;
  uchar *puVar2;
  short *psVar3;
  double dVar4;
  double dVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  ulong uVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  long lVar19;
  int iVar20;
  int iVar21;
  double dVar22;
  double __x;
  int local_70;
  int local_6c;
  
  local_6c = 0;
  memset(this->gradImg,0,(long)this->height * (long)this->width * 2);
  iVar6 = this->width;
  iVar7 = this->height;
  dVar22 = 0.0;
  if (2 < iVar7) {
    iVar21 = 1;
    local_70 = 2;
    iVar15 = 0;
    do {
      if (2 < iVar6) {
        lVar19 = 1;
        do {
          iVar16 = local_70 * iVar6;
          iVar7 = (int)lVar19;
          iVar8 = iVar16 + iVar7 + 1;
          puVar1 = this->smooth_L;
          puVar2 = this->smooth_a;
          iVar20 = local_6c * iVar6;
          iVar9 = iVar20 + iVar7 + -1;
          iVar10 = iVar20 + iVar7 + 1;
          iVar11 = iVar7 + -1 + iVar16;
          iVar12 = iVar6 * iVar21 + iVar7 + 1;
          iVar6 = iVar7 + -1 + iVar6 * iVar21;
          iVar18 = ((uint)puVar1[iVar12] - (uint)puVar1[iVar6]) +
                   ((uint)puVar1[iVar8] - (uint)puVar1[iVar9]) +
                   ((uint)puVar1[iVar10] - (uint)puVar1[iVar11]);
          iVar7 = ((uint)puVar1[lVar19 + iVar16] - (uint)puVar1[lVar19 + iVar20]) +
                  (((uint)puVar1[iVar8] - (uint)puVar1[iVar9]) -
                  ((uint)puVar1[iVar10] - (uint)puVar1[iVar11]));
          iVar17 = ((uint)puVar2[iVar12] - (uint)puVar2[iVar6]) +
                   ((uint)puVar2[iVar10] - (uint)puVar2[iVar11]) +
                   ((uint)puVar2[iVar8] - (uint)puVar2[iVar9]);
          iVar13 = ((uint)puVar2[lVar19 + iVar16] - (uint)puVar2[lVar19 + iVar20]) +
                   (((uint)puVar2[iVar8] - (uint)puVar2[iVar9]) -
                   ((uint)puVar2[iVar10] - (uint)puVar2[iVar11]));
          puVar1 = this->smooth_b;
          iVar12 = ((uint)puVar1[iVar12] - (uint)puVar1[iVar6]) +
                   ((uint)puVar1[iVar10] - (uint)puVar1[iVar11]) +
                   ((uint)puVar1[iVar8] - (uint)puVar1[iVar9]);
          iVar8 = ((uint)puVar1[lVar19 + iVar16] - (uint)puVar1[lVar19 + iVar20]) +
                  (((uint)puVar1[iVar8] - (uint)puVar1[iVar9]) -
                  ((uint)puVar1[iVar10] - (uint)puVar1[iVar11]));
          iVar9 = iVar12 * iVar12 + iVar17 * iVar17 + iVar18 * iVar18;
          iVar6 = iVar8 * iVar8 + iVar13 * iVar13 + iVar7 * iVar7;
          __x = (double)(iVar9 - iVar6);
          iVar7 = iVar8 * iVar12 + iVar13 * iVar17 + iVar7 * iVar18;
          dVar22 = (double)iVar7;
          dVar22 = atan2(dVar22 + dVar22,__x);
          dVar22 = dVar22 * 0.5;
          dVar4 = cos(dVar22 + dVar22);
          dVar5 = sin(dVar22 + dVar22);
          dVar4 = (dVar5 * (double)(iVar7 * 2) + dVar4 * __x + (double)(iVar6 + iVar9)) * 0.5;
          if (dVar4 < 0.0) {
            dVar4 = sqrt(dVar4);
          }
          else {
            dVar4 = SQRT(dVar4);
          }
          iVar7 = (int)(dVar4 + 0.5);
          this->dirImg[lVar19 + (long)iVar21 * (long)this->width] =
               (0.7853975 < ABS(dVar22)) + '\x01';
          iVar6 = this->width;
          if (iVar15 <= iVar7) {
            iVar15 = iVar7;
          }
          this->gradImg[iVar21 * iVar6 + lVar19] = (short)iVar7;
          lVar19 = lVar19 + 1;
        } while ((int)lVar19 < iVar6 + -1);
        iVar7 = this->height;
      }
      iVar21 = iVar21 + 1;
      local_6c = local_6c + 1;
      local_70 = local_70 + 1;
    } while (iVar21 < iVar7 + -1);
    dVar22 = (double)iVar15;
  }
  if (0 < iVar6 * iVar7) {
    psVar3 = this->gradImg;
    uVar14 = 0;
    do {
      psVar3[uVar14] = (short)(int)((double)(int)psVar3[uVar14] * (255.0 / dVar22));
      uVar14 = uVar14 + 1;
    } while ((uint)(iVar6 * iVar7) != uVar14);
  }
  return;
}

Assistant:

void EDColor::ComputeGradientMapByDiZenzo()
{
	memset(gradImg, 0, sizeof(short)*width*height);

	int max = 0;

	for (int i = 1; i < height - 1; i++) {
		for (int j = 1; j < width - 1; j++) {
#if 1
			// Prewitt for channel1
			int com1 = smooth_L[(i + 1)*width + j + 1] - smooth_L[(i - 1)*width + j - 1];
			int com2 = smooth_L[(i - 1)*width + j + 1] - smooth_L[(i + 1)*width + j - 1];

			int gxCh1 = com1 + com2 + (smooth_L[i*width + j + 1] - smooth_L[i*width + j - 1]);
			int gyCh1 = com1 - com2 + (smooth_L[(i + 1)*width + j] - smooth_L[(i - 1)*width + j]);

			// Prewitt for channel2
			com1 = smooth_a[(i + 1)*width + j + 1] - smooth_a[(i - 1)*width + j - 1];
			com2 = smooth_a[(i - 1)*width + j + 1] - smooth_a[(i + 1)*width + j - 1];

			int gxCh2 = com1 + com2 + (smooth_a[i*width + j + 1] - smooth_a[i*width + j - 1]);
			int gyCh2 = com1 - com2 + (smooth_a[(i + 1)*width + j] - smooth_a[(i - 1)*width + j]);

			// Prewitt for channel3
			com1 = smooth_b[(i + 1)*width + j + 1] - smooth_b[(i - 1)*width + j - 1];
			com2 = smooth_b[(i - 1)*width + j + 1] - smooth_b[(i + 1)*width + j - 1];

			int gxCh3 = com1 + com2 + (smooth_b[i*width + j + 1] - smooth_b[i*width + j - 1]);
			int gyCh3 = com1 - com2 + (smooth_b[(i + 1)*width + j] - smooth_b[(i - 1)*width + j]);
#else
			// Sobel for channel1
			int com1 = smooth_L[(i + 1)*width + j + 1] - smooth_L[(i - 1)*width + j - 1];
			int com2 = smooth_L[(i - 1)*width + j + 1] - smooth_L[(i + 1)*width + j - 1];

			int gxCh1 = com1 + com2 + 2 * (smooth_L[i*width + j + 1] - smooth_L[i*width + j - 1]);
			int gyCh1 = com1 - com2 + 2 * (smooth_L[(i + 1)*width + j] - smooth_L[(i - 1)*width + j]);

			// Sobel for channel2
			com1 = smooth_a[(i + 1)*width + j + 1] - smooth_a[(i - 1)*width + j - 1];
			com2 = smooth_a[(i - 1)*width + j + 1] - smooth_a[(i + 1)*width + j - 1];

			int gxCh2 = com1 + com2 + 2 * (smooth_a[i*width + j + 1] - smooth_a[i*width + j - 1]);
			int gyCh2 = com1 - com2 + 2 * (smooth_a[(i + 1)*width + j] - smooth_a[(i - 1)*width + j]);

			// Sobel for channel3
			com1 = smooth_b[(i + 1)*width + j + 1] - smooth_b[(i - 1)*width + j - 1];
			com2 = smooth_b[(i - 1)*width + j + 1] - smooth_b[(i + 1)*width + j - 1];

			int gxCh3 = com1 + com2 + 2 * (smooth_b[i*width + j + 1] - smooth_b[i*width + j - 1]);
			int gyCh3 = com1 - com2 + 2 * (smooth_b[(i + 1)*width + j] - smooth_b[(i - 1)*width + j]);
#endif
			int gxx = gxCh1*gxCh1 + gxCh2*gxCh2 + gxCh3*gxCh3;
			int gyy = gyCh1*gyCh1 + gyCh2*gyCh2 + gyCh3*gyCh3;
			int gxy = gxCh1*gyCh1 + gxCh2*gyCh2 + gxCh3*gyCh3;

#if 1
			// Di Zenzo's formulas from Gonzales & Woods - Page 337
			double theta = atan2(2.0*gxy, (double)(gxx - gyy)) / 2; // Gradient Direction
			int grad = (int)(sqrt(((gxx + gyy) + (gxx - gyy)*cos(2 * theta) + 2 * gxy*sin(2 * theta)) / 2.0) + 0.5); // Gradient Magnitude
#else
			// Koschan & Abidi - 2005 - Signal Processing Magazine
			double theta = atan2(2.0*gxy, (double)(gxx - gyy)) / 2; // Gradient Direction

			double cosTheta = cos(theta);
			double sinTheta = sin(theta);
			int grad = (int)(sqrt(gxx*cosTheta*cosTheta + 2 * gxy*sinTheta*cosTheta + gyy*sinTheta*sinTheta) + 0.5); // Gradient Magnitude
#endif

			// Gradient is perpendicular to the edge passing through the pixel	
			if (theta >= -3.14159 / 4 && theta <= 3.14159 / 4)
				dirImg[i*width + j] = EDGE_VERTICAL;
			else
				dirImg[i*width + j] = EDGE_HORIZONTAL;

			gradImg[i*width + j] = grad;
			if (grad > max) max = grad;

		}
	} // end outer for

	// Scale the gradient values to 0-255
	double scale = 255.0 / max;
	for (int i = 0; i<width*height; i++)
		gradImg[i] = (short)(gradImg[i] * scale);
}